

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

ForwardingTypedefSymbol *
slang::ast::ForwardingTypedefSymbol::fromSyntax(Scope *scope,ClassPropertyDeclarationSyntax *syntax)

{
  _Optional_payload_base<slang::ast::Visibility> _Var1;
  short sVar2;
  pointer pTVar3;
  size_t sVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  ForwardingTypedefSymbol *this;
  long lVar5;
  _Optional_payload_base<slang::ast::Visibility> _Var6;
  
  this = fromSyntax(scope,(ForwardTypedefDeclarationSyntax *)(syntax->declaration).ptr);
  pTVar3 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
  sVar4 = (syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  lVar5 = 0;
  _Var1._M_payload = (_Storage<slang::ast::Visibility,_true>)0x2;
  _Var1._M_engaged = true;
  _Var1._5_3_ = 0;
  do {
    if (sVar4 << 4 == lVar5) {
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes(&this->super_Symbol,scope,syntax_00);
      return this;
    }
    sVar2 = *(short *)((long)&pTVar3->kind + lVar5);
    _Var6 = _Var1;
    if (sVar2 == 0xd1) {
LAB_006afecc:
      (this->visibility).super__Optional_base<slang::ast::Visibility,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::Visibility> = _Var6;
    }
    else if (sVar2 == 0xf1) {
      _Var6._M_payload = (_Storage<slang::ast::Visibility,_true>)0x1;
      _Var6._M_engaged = true;
      _Var6._5_3_ = 0;
      goto LAB_006afecc;
    }
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

ForwardingTypedefSymbol& ForwardingTypedefSymbol::fromSyntax(
    const Scope& scope, const ClassPropertyDeclarationSyntax& syntax) {

    auto& result = fromSyntax(scope, syntax.declaration->as<ForwardTypedefDeclarationSyntax>());
    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::LocalKeyword:
                result.visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                result.visibility = Visibility::Protected;
                break;
            default:
                // Everything else is not allowed on typedefs; the parser will issue
                // a diagnostic so just ignore them here.
                break;
        }
    }

    result.setAttributes(scope, syntax.attributes);
    return result;
}